

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

void __thiscall
wabt::TypeChecker::PrintStackIfFailed
          (TypeChecker *this,Result result,char *desc,TypeVector *expected)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  unsigned_long *puVar4;
  undefined8 uVar5;
  char *types;
  string local_118;
  string local_f8;
  allocator local_d1;
  string local_d0 [8];
  string message;
  Type local_a4;
  Result result_1;
  Type type;
  size_t i;
  size_type sStack_90;
  bool incomplete_actual_stack;
  unsigned_long local_78;
  size_t kMaxActualStackToPrint;
  size_t actual_size;
  size_t max_depth;
  TypeVector actual;
  Label *local_40;
  Label *label;
  size_t limit;
  _anonymous_namespace_ *local_28;
  TypeVector *expected_local;
  char *desc_local;
  TypeChecker *this_local;
  Result result_local;
  
  limit._4_4_ = result.enum_;
  local_28 = (_anonymous_namespace_ *)expected;
  expected_local = (TypeVector *)desc;
  desc_local = (char *)this;
  this_local._4_4_ = result.enum_;
  bVar1 = Succeeded(result);
  if (!bVar1) {
    label = (Label *)0x0;
    actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = TopLabel(this,&local_40);
    bVar1 = Succeeded(actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_);
    if (bVar1) {
      label = (Label *)local_40->type_stack_limit;
    }
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&max_depth);
    sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&this->type_stack_);
    actual_size = sVar3 - (long)label;
    sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_28);
    if (sVar3 == 0) {
      local_78 = 4;
      puVar4 = std::min<unsigned_long>(&local_78,&actual_size);
      kMaxActualStackToPrint = *puVar4;
    }
    else {
      sStack_90 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_28);
      puVar4 = std::min<unsigned_long>(&stack0xffffffffffffff70,&actual_size);
      kMaxActualStackToPrint = *puVar4;
    }
    bVar1 = kMaxActualStackToPrint != actual_size;
    for (_result_1 = 0; _result_1 < kMaxActualStackToPrint; _result_1 = _result_1 + 1) {
      message.field_2._12_4_ =
           PeekType(this,~result_1.enum_ + (int)kMaxActualStackToPrint,&local_a4);
      bVar2 = Succeeded((Result)message.field_2._12_4_);
      if (!bVar2) {
        __assert_fail("Succeeded(result)",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/type-checker.cc"
                      ,0x138,
                      "void wabt::TypeChecker::PrintStackIfFailed(Result, const char *, const TypeVector &)"
                     );
      }
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back
                ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&max_depth,&local_a4);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"type mismatch in ",&local_d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::__cxx11::string::operator+=(local_d0,(char *)expected_local);
    std::__cxx11::string::operator+=(local_d0,", expected ");
    (anonymous_namespace)::TypesToString_abi_cxx11_
              (&local_f8,local_28,(TypeVector *)0x0,(char *)expected);
    std::__cxx11::string::operator+=(local_d0,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::operator+=(local_d0," but got ");
    types = (char *)0x0;
    if (bVar1) {
      types = "... ";
    }
    (anonymous_namespace)::TypesToString_abi_cxx11_
              (&local_118,(_anonymous_namespace_ *)&max_depth,(TypeVector *)types,(char *)0x0);
    std::__cxx11::string::operator+=(local_d0,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    uVar5 = std::__cxx11::string::c_str(local_d0);
    PrintError(this,"%s",uVar5);
    std::__cxx11::string::~string(local_d0);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&max_depth);
  }
  return;
}

Assistant:

void TypeChecker::PrintStackIfFailed(Result result,
                                     const char* desc,
                                     const TypeVector& expected) {
  if (Succeeded(result)) {
    return;
  }

  size_t limit = 0;
  Label* label;
  if (Succeeded(TopLabel(&label))) {
    limit = label->type_stack_limit;
  }

  TypeVector actual;
  size_t max_depth = type_stack_.size() - limit;

  // In general we want to print as many values of the actual stack as were
  // expected. However, if the stack was expected to be empty, we should
  // print some amount of the actual stack.
  size_t actual_size;
  if (expected.size() == 0) {
    // Don't print too many elements if the stack is really deep.
    const size_t kMaxActualStackToPrint = 4;
    actual_size = std::min(kMaxActualStackToPrint, max_depth);
  } else {
    actual_size = std::min(expected.size(), max_depth);
  }

  bool incomplete_actual_stack = actual_size != max_depth;

  for (size_t i = 0; i < actual_size; ++i) {
    Type type;
    Result result = PeekType(actual_size - i - 1, &type);
    WABT_USE(result);
    assert(Succeeded(result));
    actual.push_back(type);
  }

  std::string message = "type mismatch in ";
  message += desc;
  message += ", expected ";
  message += TypesToString(expected);
  message += " but got ";
  message += TypesToString(actual, incomplete_actual_stack ? "... " : nullptr);

  PrintError("%s", message.c_str());
}